

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadMemorySection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  undefined1 local_50 [8];
  Limits page_limits;
  uint local_30;
  Index memory_index;
  Index i;
  Offset section_size_local;
  BinaryReader *this_local;
  
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1e])(this->delegate_,section_size);
  bVar1 = Succeeded(RVar2);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    RVar2 = ReadCount(this,&this->num_memories_,"memory count");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else if (this->num_memories_ < 2) {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x1f])();
      bVar1 = Succeeded(RVar2);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        for (local_30 = 0; local_30 < this->num_memories_; local_30 = local_30 + 1) {
          page_limits._20_4_ = this->num_memory_imports_ + local_30;
          Limits::Limits((Limits *)local_50);
          RVar2 = ReadMemory(this,(Limits *)local_50);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x20])
                                  (this->delegate_,(ulong)(uint)page_limits._20_4_,local_50);
          bVar1 = Succeeded(RVar2);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnMemory callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x21])();
        bVar1 = Succeeded(RVar2);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndMemorySection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnMemoryCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
    else {
      PrintError(this,"memory count must be 0 or 1");
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    PrintError(this,"BeginMemorySection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadMemorySection(Offset section_size) {
  CALLBACK(BeginMemorySection, section_size);
  CHECK_RESULT(ReadCount(&num_memories_, "memory count"));
  ERROR_UNLESS(num_memories_ <= 1, "memory count must be 0 or 1");
  CALLBACK(OnMemoryCount, num_memories_);
  for (Index i = 0; i < num_memories_; ++i) {
    Index memory_index = num_memory_imports_ + i;
    Limits page_limits;
    CHECK_RESULT(ReadMemory(&page_limits));
    CALLBACK(OnMemory, memory_index, &page_limits);
  }
  CALLBACK0(EndMemorySection);
  return Result::Ok;
}